

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void fdct64_stage6_avx2(__m256i *x5,__m256i *x6,__m256i *cospi_p16,__m256i *cospi_p32,
                       __m256i *cospi_m16,__m256i *cospi_p48,__m256i *cospi_m48,__m256i *cospi_m08,
                       __m256i *cospi_p56,__m256i *cospi_m56,__m256i *cospi_m40,__m256i *cospi_p24,
                       __m256i *cospi_m24,__m256i *__rounding,int8_t cos_bit)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined1 (*in_R8) [32];
  undefined1 (*in_R9) [32];
  undefined1 (*in_stack_00000008) [32];
  __m256i in0_w0_11;
  __m256i in1_w0_10;
  __m256i in0_w1_10;
  __m256i in1_w1_10;
  __m256i in0_w0_10;
  __m256i in1_w0_9;
  __m256i in0_w1_9;
  __m256i in1_w1_9;
  __m256i in0_w0_9;
  __m256i in1_w0_8;
  __m256i in0_w1_8;
  __m256i in1_w1_8;
  __m256i in0_w0_8;
  __m256i in1_w0_7;
  __m256i in0_w1_7;
  __m256i in1_w1_7;
  __m256i in0_w0_7;
  __m256i in1_w0_6;
  __m256i in0_w1_6;
  __m256i in1_w1_6;
  __m256i in0_w0_6;
  __m256i in1_w0_5;
  __m256i in0_w1_5;
  __m256i in1_w1_5;
  __m256i in0_w0_5;
  __m256i in1_w0_4;
  __m256i in0_w1_4;
  __m256i in1_w1_4;
  __m256i in0_w0_4;
  __m256i in1_w0_3;
  __m256i in0_w1_3;
  __m256i in1_w1_3;
  __m256i in0_w0_3;
  __m256i in1_w0_2;
  __m256i in0_w1_2;
  __m256i in1_w1_2;
  __m256i in0_w0_2;
  __m256i in1_w0_1;
  __m256i in0_w1_1;
  __m256i in1_w1_1;
  __m256i in0_w0_1;
  __m256i in1_w0;
  __m256i in0_w1;
  __m256i in1_w1;
  __m256i in0_w0;
  
  auVar1 = vpmulld_avx2(*in_RDI,*in_RCX);
  auVar2 = vpmulld_avx2(in_RDI[1],*in_RCX);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  *in_RSI = auVar1;
  auVar1 = vpaddd_avx2(*in_RSI,(undefined1  [32])*cospi_m24);
  *in_RSI = auVar1;
  auVar1 = vpsrad_avx2(*in_RSI,ZEXT416((uint)(int)(char)__rounding));
  *in_RSI = auVar1;
  auVar1 = vpmulld_avx2(*in_RDI,*in_RCX);
  auVar2 = vpmulld_avx2(in_RDI[1],*in_RCX);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[1] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[1],(undefined1  [32])*cospi_m24);
  in_RSI[1] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[1],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[1] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[3],*in_RDX);
  auVar2 = vpmulld_avx2(in_RDI[2],*in_R9);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[2] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[2],(undefined1  [32])*cospi_m24);
  in_RSI[2] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[2],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[2] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[3],*in_R9);
  auVar2 = vpmulld_avx2(in_RDI[2],*in_RDX);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[3] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[3],(undefined1  [32])*cospi_m24);
  in_RSI[3] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[3],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[3] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[4],in_RDI[5]);
  in_RSI[4] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[4],in_RDI[5]);
  in_RSI[5] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[7],in_RDI[6]);
  in_RSI[6] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[7],in_RDI[6]);
  in_RSI[7] = auVar1;
  uVar3 = *(undefined8 *)(in_RDI[8] + 8);
  uVar4 = *(undefined8 *)(in_RDI[8] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[8] + 0x18);
  *(undefined8 *)in_RSI[8] = *(undefined8 *)in_RDI[8];
  *(undefined8 *)(in_RSI[8] + 8) = uVar3;
  *(undefined8 *)(in_RSI[8] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[8] + 0x18) = uVar5;
  auVar1 = vpmulld_avx2(in_RDI[9],*in_R8);
  auVar2 = vpmulld_avx2(in_RDI[0xe],*in_R9);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[9] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[9],(undefined1  [32])*cospi_m24);
  in_RSI[9] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[9],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[9] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[9],*in_R9);
  auVar2 = vpmulld_avx2(in_RDI[0xe],*in_R8);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0xe] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0xe],(undefined1  [32])*cospi_m24);
  in_RSI[0xe] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0xe],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0xe] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[10],*in_stack_00000008);
  auVar2 = vpmulld_avx2(in_RDI[0xd],*in_R8);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[10] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[10],(undefined1  [32])*cospi_m24);
  in_RSI[10] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[10],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[10] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[10],*in_R8);
  auVar2 = vpmulld_avx2(in_RDI[0xd],*in_stack_00000008);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0xd] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0xd],(undefined1  [32])*cospi_m24);
  in_RSI[0xd] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0xd],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0xd] = auVar1;
  uVar3 = *(undefined8 *)(in_RDI[0xb] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0xb] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0xb] + 0x18);
  *(undefined8 *)in_RSI[0xb] = *(undefined8 *)in_RDI[0xb];
  *(undefined8 *)(in_RSI[0xb] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0xb] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0xb] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0xc] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0xc] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0xc] + 0x18);
  *(undefined8 *)in_RSI[0xc] = *(undefined8 *)in_RDI[0xc];
  *(undefined8 *)(in_RSI[0xc] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0xc] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0xc] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0xf] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0xf] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0xf] + 0x18);
  *(undefined8 *)in_RSI[0xf] = *(undefined8 *)in_RDI[0xf];
  *(undefined8 *)(in_RSI[0xf] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0xf] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0xf] + 0x18) = uVar5;
  auVar1 = vpaddd_avx2(in_RDI[0x10],in_RDI[0x13]);
  in_RSI[0x10] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x10],in_RDI[0x13]);
  in_RSI[0x13] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x11],in_RDI[0x12]);
  in_RSI[0x11] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x11],in_RDI[0x12]);
  in_RSI[0x12] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x17],in_RDI[0x14]);
  in_RSI[0x14] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x17],in_RDI[0x14]);
  in_RSI[0x17] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x16],in_RDI[0x15]);
  in_RSI[0x15] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x16],in_RDI[0x15]);
  in_RSI[0x16] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x18],in_RDI[0x1b]);
  in_RSI[0x18] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x18],in_RDI[0x1b]);
  in_RSI[0x1b] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x19],in_RDI[0x1a]);
  in_RSI[0x19] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x19],in_RDI[0x1a]);
  in_RSI[0x1a] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x1f],in_RDI[0x1c]);
  in_RSI[0x1c] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x1f],in_RDI[0x1c]);
  in_RSI[0x1f] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0x1e],in_RDI[0x1d]);
  in_RSI[0x1d] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0x1e],in_RDI[0x1d]);
  in_RSI[0x1e] = auVar1;
  uVar3 = *(undefined8 *)(in_RDI[0x20] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x20] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x20] + 0x18);
  *(undefined8 *)in_RSI[0x20] = *(undefined8 *)in_RDI[0x20];
  *(undefined8 *)(in_RSI[0x20] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x20] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x20] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x21] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x21] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x21] + 0x18);
  *(undefined8 *)in_RSI[0x21] = *(undefined8 *)in_RDI[0x21];
  *(undefined8 *)(in_RSI[0x21] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x21] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x21] + 0x18) = uVar5;
  auVar1 = vpmulld_avx2(in_RDI[0x22],(undefined1  [32])*cospi_m48);
  auVar2 = vpmulld_avx2(in_RDI[0x3d],(undefined1  [32])*cospi_m08);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x22] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x22],(undefined1  [32])*cospi_m24);
  in_RSI[0x22] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x22],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x22] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x22],(undefined1  [32])*cospi_m08);
  auVar2 = vpmulld_avx2(in_RDI[0x3d],(undefined1  [32])*cospi_m48);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x3d] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x3d],(undefined1  [32])*cospi_m24);
  in_RSI[0x3d] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x3d],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x3d] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x23],(undefined1  [32])*cospi_m48);
  auVar2 = vpmulld_avx2(in_RDI[0x3c],(undefined1  [32])*cospi_m08);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x23] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x23],(undefined1  [32])*cospi_m24);
  in_RSI[0x23] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x23],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x23] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x23],(undefined1  [32])*cospi_m08);
  auVar2 = vpmulld_avx2(in_RDI[0x3c],(undefined1  [32])*cospi_m48);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x3c] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x3c],(undefined1  [32])*cospi_m24);
  in_RSI[0x3c] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x3c],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x3c] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x24],(undefined1  [32])*cospi_p56);
  auVar2 = vpmulld_avx2(in_RDI[0x3b],(undefined1  [32])*cospi_m48);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x24] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x24],(undefined1  [32])*cospi_m24);
  in_RSI[0x24] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x24],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x24] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x24],(undefined1  [32])*cospi_m48);
  auVar2 = vpmulld_avx2(in_RDI[0x3b],(undefined1  [32])*cospi_p56);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x3b] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x3b],(undefined1  [32])*cospi_m24);
  in_RSI[0x3b] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x3b],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x3b] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x25],(undefined1  [32])*cospi_p56);
  auVar2 = vpmulld_avx2(in_RDI[0x3a],(undefined1  [32])*cospi_m48);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x25] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x25],(undefined1  [32])*cospi_m24);
  in_RSI[0x25] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x25],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x25] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x25],(undefined1  [32])*cospi_m48);
  auVar2 = vpmulld_avx2(in_RDI[0x3a],(undefined1  [32])*cospi_p56);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x3a] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x3a],(undefined1  [32])*cospi_m24);
  in_RSI[0x3a] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x3a],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x3a] = auVar1;
  uVar3 = *(undefined8 *)(in_RDI[0x26] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x26] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x26] + 0x18);
  *(undefined8 *)in_RSI[0x26] = *(undefined8 *)in_RDI[0x26];
  *(undefined8 *)(in_RSI[0x26] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x26] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x26] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x27] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x27] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x27] + 0x18);
  *(undefined8 *)in_RSI[0x27] = *(undefined8 *)in_RDI[0x27];
  *(undefined8 *)(in_RSI[0x27] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x27] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x27] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x28] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x28] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x28] + 0x18);
  *(undefined8 *)in_RSI[0x28] = *(undefined8 *)in_RDI[0x28];
  *(undefined8 *)(in_RSI[0x28] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x28] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x28] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x29] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x29] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x29] + 0x18);
  *(undefined8 *)in_RSI[0x29] = *(undefined8 *)in_RDI[0x29];
  *(undefined8 *)(in_RSI[0x29] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x29] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x29] + 0x18) = uVar5;
  auVar1 = vpmulld_avx2(in_RDI[0x2a],(undefined1  [32])*cospi_m56);
  auVar2 = vpmulld_avx2(in_RDI[0x35],(undefined1  [32])*cospi_m40);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x2a] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x2a],(undefined1  [32])*cospi_m24);
  in_RSI[0x2a] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x2a],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x2a] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2a],(undefined1  [32])*cospi_m40);
  auVar2 = vpmulld_avx2(in_RDI[0x35],(undefined1  [32])*cospi_m56);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x35] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x35],(undefined1  [32])*cospi_m24);
  in_RSI[0x35] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x35],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x35] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2b],(undefined1  [32])*cospi_m56);
  auVar2 = vpmulld_avx2(in_RDI[0x34],(undefined1  [32])*cospi_m40);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x2b] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x2b],(undefined1  [32])*cospi_m24);
  in_RSI[0x2b] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x2b],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x2b] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2b],(undefined1  [32])*cospi_m40);
  auVar2 = vpmulld_avx2(in_RDI[0x34],(undefined1  [32])*cospi_m56);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x34] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x34],(undefined1  [32])*cospi_m24);
  in_RSI[0x34] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x34],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x34] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2c],(undefined1  [32])*cospi_p24);
  auVar2 = vpmulld_avx2(in_RDI[0x33],(undefined1  [32])*cospi_m56);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x2c] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x2c],(undefined1  [32])*cospi_m24);
  in_RSI[0x2c] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x2c],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x2c] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2c],(undefined1  [32])*cospi_m56);
  auVar2 = vpmulld_avx2(in_RDI[0x33],(undefined1  [32])*cospi_p24);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x33] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x33],(undefined1  [32])*cospi_m24);
  in_RSI[0x33] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x33],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x33] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2d],(undefined1  [32])*cospi_p24);
  auVar2 = vpmulld_avx2(in_RDI[0x32],(undefined1  [32])*cospi_m56);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x2d] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x2d],(undefined1  [32])*cospi_m24);
  in_RSI[0x2d] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x2d],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x2d] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2d],(undefined1  [32])*cospi_m56);
  auVar2 = vpmulld_avx2(in_RDI[0x32],(undefined1  [32])*cospi_p24);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x32] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x32],(undefined1  [32])*cospi_m24);
  in_RSI[0x32] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x32],ZEXT416((uint)(int)(char)__rounding));
  in_RSI[0x32] = auVar1;
  uVar3 = *(undefined8 *)(in_RDI[0x2e] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x2e] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x2e] + 0x18);
  *(undefined8 *)in_RSI[0x2e] = *(undefined8 *)in_RDI[0x2e];
  *(undefined8 *)(in_RSI[0x2e] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x2e] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x2e] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x2f] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x2f] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x2f] + 0x18);
  *(undefined8 *)in_RSI[0x2f] = *(undefined8 *)in_RDI[0x2f];
  *(undefined8 *)(in_RSI[0x2f] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x2f] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x2f] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x30] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x30] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x30] + 0x18);
  *(undefined8 *)in_RSI[0x30] = *(undefined8 *)in_RDI[0x30];
  *(undefined8 *)(in_RSI[0x30] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x30] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x30] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x31] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x31] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x31] + 0x18);
  *(undefined8 *)in_RSI[0x31] = *(undefined8 *)in_RDI[0x31];
  *(undefined8 *)(in_RSI[0x31] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x31] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x31] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x36] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x36] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x36] + 0x18);
  *(undefined8 *)in_RSI[0x36] = *(undefined8 *)in_RDI[0x36];
  *(undefined8 *)(in_RSI[0x36] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x36] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x36] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x37] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x37] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x37] + 0x18);
  *(undefined8 *)in_RSI[0x37] = *(undefined8 *)in_RDI[0x37];
  *(undefined8 *)(in_RSI[0x37] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x37] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x37] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x38] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x38] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x38] + 0x18);
  *(undefined8 *)in_RSI[0x38] = *(undefined8 *)in_RDI[0x38];
  *(undefined8 *)(in_RSI[0x38] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x38] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x38] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x39] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x39] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x39] + 0x18);
  *(undefined8 *)in_RSI[0x39] = *(undefined8 *)in_RDI[0x39];
  *(undefined8 *)(in_RSI[0x39] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x39] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x39] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x3e] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x3e] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x3e] + 0x18);
  *(undefined8 *)in_RSI[0x3e] = *(undefined8 *)in_RDI[0x3e];
  *(undefined8 *)(in_RSI[0x3e] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x3e] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x3e] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x3f] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x3f] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x3f] + 0x18);
  *(undefined8 *)in_RSI[0x3f] = *(undefined8 *)in_RDI[0x3f];
  *(undefined8 *)(in_RSI[0x3f] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x3f] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x3f] + 0x18) = uVar5;
  return;
}

Assistant:

static inline void fdct64_stage6_avx2(
    __m256i *x5, __m256i *x6, __m256i *cospi_p16, __m256i *cospi_p32,
    __m256i *cospi_m16, __m256i *cospi_p48, __m256i *cospi_m48,
    __m256i *cospi_m08, __m256i *cospi_p56, __m256i *cospi_m56,
    __m256i *cospi_m40, __m256i *cospi_p24, __m256i *cospi_m24,
    const __m256i *__rounding, int8_t cos_bit) {
  btf_32_type0_avx2_new(*cospi_p32, *cospi_p32, x5[0], x5[1], x6[0], x6[1],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_p16, *cospi_p48, x5[3], x5[2], x6[2], x6[3],
                        *__rounding, cos_bit);
  x6[4] = _mm256_add_epi32(x5[4], x5[5]);
  x6[5] = _mm256_sub_epi32(x5[4], x5[5]);
  x6[6] = _mm256_sub_epi32(x5[7], x5[6]);
  x6[7] = _mm256_add_epi32(x5[7], x5[6]);
  x6[8] = x5[8];
  btf_32_type0_avx2_new(*cospi_m16, *cospi_p48, x5[9], x5[14], x6[9], x6[14],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m48, *cospi_m16, x5[10], x5[13], x6[10], x6[13],
                        *__rounding, cos_bit);
  x6[11] = x5[11];
  x6[12] = x5[12];
  x6[15] = x5[15];
  x6[16] = _mm256_add_epi32(x5[16], x5[19]);
  x6[19] = _mm256_sub_epi32(x5[16], x5[19]);
  x6[17] = _mm256_add_epi32(x5[17], x5[18]);
  x6[18] = _mm256_sub_epi32(x5[17], x5[18]);
  x6[20] = _mm256_sub_epi32(x5[23], x5[20]);
  x6[23] = _mm256_add_epi32(x5[23], x5[20]);
  x6[21] = _mm256_sub_epi32(x5[22], x5[21]);
  x6[22] = _mm256_add_epi32(x5[22], x5[21]);
  x6[24] = _mm256_add_epi32(x5[24], x5[27]);
  x6[27] = _mm256_sub_epi32(x5[24], x5[27]);
  x6[25] = _mm256_add_epi32(x5[25], x5[26]);
  x6[26] = _mm256_sub_epi32(x5[25], x5[26]);
  x6[28] = _mm256_sub_epi32(x5[31], x5[28]);
  x6[31] = _mm256_add_epi32(x5[31], x5[28]);
  x6[29] = _mm256_sub_epi32(x5[30], x5[29]);
  x6[30] = _mm256_add_epi32(x5[30], x5[29]);
  x6[32] = x5[32];
  x6[33] = x5[33];
  btf_32_type0_avx2_new(*cospi_m08, *cospi_p56, x5[34], x5[61], x6[34], x6[61],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m08, *cospi_p56, x5[35], x5[60], x6[35], x6[60],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m56, *cospi_m08, x5[36], x5[59], x6[36], x6[59],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m56, *cospi_m08, x5[37], x5[58], x6[37], x6[58],
                        *__rounding, cos_bit);
  x6[38] = x5[38];
  x6[39] = x5[39];
  x6[40] = x5[40];
  x6[41] = x5[41];
  btf_32_type0_avx2_new(*cospi_m40, *cospi_p24, x5[42], x5[53], x6[42], x6[53],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m40, *cospi_p24, x5[43], x5[52], x6[43], x6[52],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m24, *cospi_m40, x5[44], x5[51], x6[44], x6[51],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m24, *cospi_m40, x5[45], x5[50], x6[45], x6[50],
                        *__rounding, cos_bit);
  x6[46] = x5[46];
  x6[47] = x5[47];
  x6[48] = x5[48];
  x6[49] = x5[49];
  x6[54] = x5[54];
  x6[55] = x5[55];
  x6[56] = x5[56];
  x6[57] = x5[57];
  x6[62] = x5[62];
  x6[63] = x5[63];
}